

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType::~IfcBuildingElementProxyType
          (IfcBuildingElementProxyType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x8d3c90;
  *(undefined8 *)&this->field_0x30 = 0x8d3da8;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8d3cb8;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8d3ce0;
  *(undefined8 *)&this[-1].field_0x138 = 0x8d3d08;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x8d3d30;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x8d3d58;
  *(undefined8 *)this = 0x8d3d80;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x8d4070;
  *(undefined8 *)&this->field_0x30 = 0x8d4138;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8d4098;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8d40c0;
  *(undefined8 *)&this[-1].field_0x138 = 0x8d40e8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x8d4110;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>.
             field_0x10;
  if (puVar1 != &this[-1].
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuildingElementProxyType,_1UL>.
                 field_0x20) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__008d3dd0);
  return;
}

Assistant:

IfcBuildingElementProxyType() : Object("IfcBuildingElementProxyType") {}